

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

void __thiscall Input_Port::Destroy(Input_Port *this,Am_Constraint *self)

{
  bool bVar1;
  Am_Constraint *pAVar2;
  Am_Constraint_Tag dependency_tag;
  Am_Slot slot;
  Am_Dependency_Iterator iter;
  
  slot.data = (this->context).data;
  (this->context).data = (Am_Slot_Data *)0x0;
  if (this->next != (Input_Port *)0x0) {
    Destroy(this->next,self);
    this->next = (Input_Port *)0x0;
  }
  Am_Dependency_Iterator::Am_Dependency_Iterator(&iter,&slot);
  Am_Dependency_Iterator::Start(&iter);
  do {
    bVar1 = Am_Dependency_Iterator::Last(&iter);
    if (bVar1) {
LAB_001d9b9f:
      Am_Value::~Am_Value(&this->prev_value);
      operator_delete(this,0x48);
      return;
    }
    pAVar2 = Am_Dependency_Iterator::Get(&iter);
    if (pAVar2 == self) {
      dependency_tag = Am_Dependency_Iterator::Get_Tag(&iter);
      Am_Slot::Remove_Dependency(&slot,dependency_tag);
      goto LAB_001d9b9f;
    }
    Am_Dependency_Iterator::Next(&iter);
  } while( true );
}

Assistant:

void Destroy(Am_Constraint *self)
  {
    Am_Slot slot = context;
    context = (Am_Slot_Data *)nullptr;
    if (next) {
      next->Destroy(self);
      next = nullptr;
    }
    Am_Dependency_Iterator iter(slot);
    Am_Constraint *curr;
    for (iter.Start(); !iter.Last(); iter.Next()) {
      curr = iter.Get();
      if (curr == self) {
        Am_Constraint_Tag tag = iter.Get_Tag();
        slot.Remove_Dependency(tag);
        break;
      }
    }
    delete this;
  }